

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::CapTableBuilder*,capnp::(anonymous_namespace)::MembraneCapTableBuilder*>&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<capnp::_::CapTableBuilder_*,_capnp::(anonymous_namespace)::MembraneCapTableBuilder_*>
          *params)

{
  char *pcVar1;
  size_t sVar2;
  String argValues [1];
  char **ppcVar3;
  undefined8 uVar4;
  char *local_b8;
  size_t sStack_b0;
  ArrayDisposer *pAStack_a8;
  char **local_98;
  undefined8 uStack_90;
  String local_88;
  CappedArray<char,_17UL> local_68;
  CappedArray<char,_17UL> local_48;
  
  this->exception = (Exception *)0x0;
  Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(void **)file);
  Stringifier::operator*(&local_68,(Stringifier *)&_::STR,*(void **)(file + 8));
  concat<kj::CappedArray<char,17ul>,kj::StringPtr&,kj::CappedArray<char,17ul>>
            (&local_88,(_ *)&local_48,(CappedArray<char,_17UL> *)(file + 0x10),
             (StringPtr *)&local_68,(CappedArray<char,_17UL> *)condition);
  ppcVar3 = &local_b8;
  local_b8 = local_88.content.ptr;
  sStack_b0 = local_88.content.size_;
  pAStack_a8 = local_88.content.disposer;
  uStack_90 = 1;
  uVar4 = 1;
  local_98 = ppcVar3;
  init(this,(EVP_PKEY_CTX *)
            "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++"
      );
  sVar2 = sStack_b0;
  pcVar1 = local_b8;
  if (local_b8 != (char *)0x0) {
    local_b8 = (char *)0x0;
    sStack_b0 = 0;
    (**pAStack_a8->_vptr_ArrayDisposer)(pAStack_a8,pcVar1,1,sVar2,sVar2,0,ppcVar3,uVar4);
  }
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}